

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void ggml_backend_sched_reset(ggml_backend_sched_t sched)

{
  byte *in_RDI;
  
  if ((*in_RDI & 1) == 0) {
    ggml_hash_set_reset((ggml_hash_set *)sched);
    memset(*(void **)(in_RDI + 0x128),0xff,*(long *)(in_RDI + 0x110) << 2);
    memset(*(void **)(in_RDI + 0x130),0,
           *(long *)(in_RDI + 0x110) * (long)*(int *)(in_RDI + 4) * (long)*(int *)(in_RDI + 0x1b8) *
           8);
    *in_RDI = 1;
  }
  in_RDI[1] = 0;
  return;
}

Assistant:

void ggml_backend_sched_reset(ggml_backend_sched_t sched) {
    // reset state for the next run
    if (!sched->is_reset) {
        ggml_hash_set_reset(&sched->hash_set);
        memset(sched->hv_tensor_backend_ids, -1, sched->hash_set.size * sizeof(sched->hv_tensor_backend_ids[0]));
        memset(sched->hv_tensor_copies,       0, sched->hash_set.size * sched->n_backends * sched->n_copies * sizeof(struct ggml_tensor *));
        sched->is_reset = true;
    }
    sched->is_alloc = false;
}